

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

int set_parts(void)

{
  CURLUcode CVar1;
  int iVar2;
  char *pcStack_28;
  CURLUcode uc;
  char *url;
  CURLU *urlp;
  int local_10;
  CURLUcode rc;
  int error;
  int i;
  
  local_10 = 0;
  rc = CURLUE_OK;
  while( true ) {
    if (set_parts_list[(int)rc].set == (char *)0x0 || local_10 != 0) {
      return local_10;
    }
    url = (char *)curl_url();
    if (url == (char *)0x0) break;
    if (set_parts_list[(int)rc].in == (char *)0x0) {
      urlp._4_4_ = CURLUE_OK;
    }
    else {
      urlp._4_4_ = curl_url_set(url,0,set_parts_list[(int)rc].in,set_parts_list[(int)rc].urlflags);
    }
    if (urlp._4_4_ == CURLUE_OK) {
      pcStack_28 = (char *)0x0;
      CVar1 = updateurl((CURLU *)url,set_parts_list[(int)rc].set,set_parts_list[(int)rc].setflags);
      if (CVar1 != set_parts_list[(int)rc].pcode) {
        curl_mfprintf(_stderr,"updateurl\nin: %s\nreturned %d (expected %d)\n",
                      set_parts_list[(int)rc].set,CVar1,set_parts_list[(int)rc].pcode);
        local_10 = local_10 + 1;
      }
      urlp._4_4_ = curl_url_get(url,0,&stack0xffffffffffffffd8);
      if (urlp._4_4_ == CURLUE_OK) {
        iVar2 = checkurl(pcStack_28,set_parts_list[(int)rc].out);
        if (iVar2 != 0) {
          local_10 = local_10 + 1;
        }
      }
      else {
        curl_mfprintf(_stderr,"%s:%d Get URL returned %d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1560.c"
                      ,0x30e,urlp._4_4_);
        local_10 = local_10 + 1;
      }
      curl_free(pcStack_28);
    }
    else if (urlp._4_4_ != set_parts_list[(int)rc].ucode) {
      curl_mfprintf(_stderr,"Set parts\nin: %s\nreturned %d (expected %d)\n",
                    set_parts_list[(int)rc].in,urlp._4_4_,set_parts_list[(int)rc].ucode);
      local_10 = local_10 + 1;
    }
    curl_url_cleanup(url);
    rc = rc + CURLUE_BAD_HANDLE;
  }
  return local_10 + 1;
}

Assistant:

static int set_parts(void)
{
  int i;
  int error = 0;

  for(i = 0; set_parts_list[i].set && !error; i++) {
    CURLUcode rc;
    CURLU *urlp = curl_url();
    if(!urlp) {
      error++;
      break;
    }
    if(set_parts_list[i].in)
      rc = curl_url_set(urlp, CURLUPART_URL, set_parts_list[i].in,
                        set_parts_list[i].urlflags);
    else
      rc = CURLUE_OK;
    if(!rc) {
      char *url = NULL;
      CURLUcode uc = updateurl(urlp, set_parts_list[i].set,
                               set_parts_list[i].setflags);

      if(uc != set_parts_list[i].pcode) {
        fprintf(stderr, "updateurl\nin: %s\nreturned %d (expected %d)\n",
                set_parts_list[i].set, (int)uc, set_parts_list[i].pcode);
        error++;
      }

      rc = curl_url_get(urlp, CURLUPART_URL, &url, 0);

      if(rc) {
        fprintf(stderr, "%s:%d Get URL returned %d\n",
                __FILE__, __LINE__, (int)rc);
        error++;
      }
      else if(checkurl(url, set_parts_list[i].out)) {
        error++;
      }
      curl_free(url);
    }
    else if(rc != set_parts_list[i].ucode) {
      fprintf(stderr, "Set parts\nin: %s\nreturned %d (expected %d)\n",
              set_parts_list[i].in, (int)rc, set_parts_list[i].ucode);
      error++;
    }
    curl_url_cleanup(urlp);
  }
  return error;
}